

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printc.cc
# Opt level: O2

void __thiscall PrintC::emitExpression(PrintC *this,PcodeOp *op)

{
  Varnode *pVVar1;
  PcodeOp *op_00;
  bool bVar2;
  
  pVVar1 = op->output;
  if (pVVar1 == (Varnode *)0x0) {
    if ((op->addlflags & 0x10) != 0) {
      op_00 = (op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
              super__Vector_impl_data._M_start[1]->def;
      pVVar1 = op_00->output;
      PrintLanguage::pushOp(&this->super_PrintLanguage,&assignment,op_00);
      PrintLanguage::pushVnLHS(&this->super_PrintLanguage,pVVar1,op_00);
      (*(this->super_PrintLanguage)._vptr_PrintLanguage[0x2f])(this,op,1);
      goto LAB_0032aa6f;
    }
  }
  else {
    if ((this->super_PrintLanguage).field_0xfd == '\x01') {
      bVar2 = emitInplaceOp(this,op);
      if (bVar2) {
        return;
      }
    }
    PrintLanguage::pushOp(&this->super_PrintLanguage,&assignment,op);
    PrintLanguage::pushVnLHS(&this->super_PrintLanguage,pVVar1,op);
  }
  (*op->opcode->_vptr_TypeOp[9])(op->opcode,this,op);
LAB_0032aa6f:
  PrintLanguage::recurse(&this->super_PrintLanguage);
  return;
}

Assistant:

void PrintC::emitExpression(const PcodeOp *op)
   
{
  const Varnode *outvn = op->getOut();
  if (outvn != (Varnode *)0) {
    if (option_inplace_ops && emitInplaceOp(op)) return;
    pushOp(&assignment,op);
    pushVnLHS(outvn,op);
  }
  else if (op->doesSpecialPrinting()) {
    // Printing of constructor syntax
    const PcodeOp *newop = op->getIn(1)->getDef();
    outvn = newop->getOut();
    pushOp(&assignment,newop);
    pushVnLHS(outvn,newop);
    opConstructor(op,true);
    recurse();
    return;
  }
    // If STORE, print  *( ) = ( )
    // If BRANCH, print nothing
    // If CBRANCH, print condition  ( )
    // If BRANCHIND, print switch( )
    // If CALL, CALLIND, CALLOTHER  print  call
    // If RETURN,   print return ( )
  op->push(this);
  recurse();
}